

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O2

void * myEmployeeCustomConstructor::ArchiveINconstructor(ChArchiveIn *marchive)

{
  myEmployeeCustomConstructor *this;
  int kids;
  double latitude;
  ChNameValue<int> local_50;
  ChNameValue<double> local_38;
  
  chrono::ChArchiveIn::VersionRead<myEmployeeCustomConstructor>(marchive);
  local_38._value = &latitude;
  local_38._name = "latitude";
  local_38._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_38);
  local_50._value = &kids;
  local_50._name = "kids";
  local_50._flags = '\0';
  chrono::ChArchiveIn::operator>>(marchive,&local_50);
  this = (myEmployeeCustomConstructor *)operator_new(0x50);
  myEmployeeCustomConstructor(this,kids,latitude);
  return this;
}

Assistant:

static void* ArchiveINconstructor(ChArchiveIn& marchive)
    {
        // suggested: use versioning
        /*int version =*/ marchive.VersionRead<myEmployeeCustomConstructor>();

        // 1) Deserialize the parameters of the constructor:
        // you need some auxiliary variables because this method is static 
        // (the object will be created right after the >> parsing)
        // Note, be sure that the names of those auxiliary vars are the same of member 
        // variables of your class, or use  CHNVP(..., "myname") tags.
        double latitude;   
        int    kids;
        marchive >> CHNVP(latitude);
        marchive >> CHNVP(kids);

        // 2) Important!!! Finally you MUST return an object of this class, 
        // constructed with the parameters that you just deserialized:
        return new myEmployeeCustomConstructor(kids, latitude);
    }